

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_filters.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  uint32_t uVar6;
  uchar *puVar7;
  uint8_t uVar8;
  imageException *this;
  Image filtered;
  string filePath;
  string local_c0;
  Image local_a0;
  undefined1 local_78 [32];
  uint8_t local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"lena.bmp","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)__s);
  }
  Bitmap_Operation::Load(&local_a0,&local_50);
  if (local_a0._data != (uchar *)0x0) {
    if (local_a0._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)local_78,&local_a0);
      uVar8 = local_a0._type;
      puVar7 = local_a0._data;
      uVar6 = local_a0._rowSize;
      uVar4 = local_a0._16_2_;
      uVar2 = local_a0._8_8_;
      local_a0._width = local_78._8_4_;
      local_a0._height = local_78._12_4_;
      uVar3 = local_a0._8_8_;
      local_a0._width = (uint32_t)uVar2;
      local_a0._height = SUB84(uVar2,4);
      local_78._8_4_ = local_a0._width;
      local_78._12_4_ = local_a0._height;
      local_a0._colorCount = local_78[0x10];
      local_a0._alignment = local_78[0x11];
      uVar5 = local_a0._16_2_;
      local_a0._colorCount = (uint8_t)uVar4;
      local_a0._alignment = SUB21(uVar4,1);
      local_78[0x10] = local_a0._colorCount;
      local_78[0x11] = local_a0._alignment;
      local_a0._rowSize = local_78._20_4_;
      local_78._20_4_ = uVar6;
      local_a0._data = (uchar *)local_78._24_8_;
      local_78._24_8_ = puVar7;
      local_a0._type = local_58;
      local_58 = uVar8;
      local_78._0_8_ = &PTR__ImageTemplate_0011cc30;
      local_a0._8_8_ = uVar3;
      local_a0._16_2_ = uVar5;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_78);
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)local_78,local_a0._width,local_a0._height,'\x01',
               '\x01');
    Image_Function::Median(&local_a0,(Image *)local_78,3);
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"median.bmp","");
    Bitmap_Operation::Save(&local_c0,(Image *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    Image_Function::Prewitt(&local_a0,(Image *)local_78);
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"prewitt.bmp","");
    Bitmap_Operation::Save(&local_c0,(Image *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    Image_Function::Sobel(&local_a0,(Image *)local_78);
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sobel.bmp","");
    Bitmap_Operation::Save(&local_c0,(Image *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_78._0_8_ = &PTR__ImageTemplate_0011cc30;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_78);
    local_a0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011cc30;
    PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Application ended correctly.",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    return 0;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Cannot load ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_c0,&local_50);
  imageException::imageException(this,(string *)local_78);
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    // This example application is made to show how filters work and what which results they produce

    try // <---- do not forget to put your code into try.. catch block!
    {
       std::string filePath = "lena.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        // Load an image
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Create Image object which will contain filtered image
        PenguinV_Image::Image filtered( image.width(), image.height() );

        // Median filtering
        Image_Function::Median( image, filtered, 3 );
        Bitmap_Operation::Save( "median.bmp", filtered );

        // Prewitt filtering
        Image_Function::Prewitt( image, filtered );
        Bitmap_Operation::Save( "prewitt.bmp", filtered );

        // Sobel filtering
        Image_Function::Sobel( image, filtered );
        Bitmap_Operation::Save( "sobel.bmp", filtered );
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}